

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# division_operations.c
# Opt level: O1

int32_t WebRtcSpl_DivResultInQ31(int32_t num,int32_t den)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int32_t L_den;
  int32_t L_num;
  int iVar5;
  
  if (num != 0) {
    iVar2 = -num;
    if (0 < num) {
      iVar2 = num;
    }
    iVar4 = -den;
    if (0 < den) {
      iVar4 = den;
    }
    iVar3 = 0;
    iVar5 = -0x1f;
    do {
      iVar1 = iVar2 * 2;
      iVar2 = 0;
      if (iVar4 <= iVar1) {
        iVar2 = iVar4;
      }
      iVar2 = iVar1 - iVar2;
      iVar3 = (uint)(iVar4 <= iVar1) + iVar3 * 2;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
    iVar2 = -iVar3;
    if (-(num >> 0x1f) - (den >> 0x1f) != 1) {
      iVar2 = iVar3;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int32_t WebRtcSpl_DivResultInQ31(int32_t num, int32_t den)
{
    int32_t L_num = num;
    int32_t L_den = den;
    int32_t div = 0;
    int k = 31;
    int change_sign = 0;

    if (num == 0)
        return 0;

    if (num < 0)
    {
        change_sign++;
        L_num = -num;
    }
    if (den < 0)
    {
        change_sign++;
        L_den = -den;
    }
    while (k--)
    {
        div <<= 1;
        L_num <<= 1;
        if (L_num >= L_den)
        {
            L_num -= L_den;
            div++;
        }
    }
    if (change_sign == 1)
    {
        div = -div;
    }
    return div;
}